

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesDeviceGetOverclockControlsPrologue
          (ZESParameterValidation *this,zes_device_handle_t hDevice,
          zes_overclock_domain_t domainType,uint32_t *pAvailableControls)

{
  uint32_t *pAvailableControls_local;
  zes_overclock_domain_t domainType_local;
  zes_device_handle_t hDevice_local;
  ZESParameterValidation *this_local;
  
  if (hDevice == (zes_device_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if ((int)domainType < 0x101) {
    if (pAvailableControls == (uint32_t *)0x0) {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else {
      this_local._4_4_ = ZE_RESULT_SUCCESS;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesDeviceGetOverclockControlsPrologue(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        zes_overclock_domain_t domainType,              ///< [in] Domain type.
        uint32_t* pAvailableControls                    ///< [in,out] Returns the overclock controls that are supported for the
                                                        ///< specified overclock domain (a bit for each of enum
                                                        ///< ::zes_overclock_control_t).
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( ZES_OVERCLOCK_DOMAIN_ADM < domainType )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( nullptr == pAvailableControls )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }